

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifAig.c
# Opt level: O3

Abc_Obj_t * Io_BlifParseConstruct_rec(Io_BlifMan_t *p,char *pName)

{
  byte bVar1;
  int iVar2;
  Io_BlifObj_t *pIVar3;
  uint uVar4;
  uint uVar5;
  Io_BlifObj_t **ppIVar6;
  Vec_Ptr_t *vTokens;
  void **ppvVar7;
  Abc_Obj_t *pAVar8;
  size_t sVar9;
  Vec_Ptr_t *pVVar10;
  Abc_Obj_t *pAVar11;
  int i;
  ulong uVar12;
  ulong uVar13;
  Abc_Obj_t *p1;
  ulong uVar14;
  char *pcVar15;
  ulong uVar16;
  char *pcVar17;
  char *__format;
  Abc_Aig_t *pMan;
  long lVar18;
  long lVar19;
  uint local_3c;
  
  ppIVar6 = Io_BlifHashLookup((Io_BlifMan_t *)p->pTable,(char *)(ulong)(uint)p->nTableSize);
  pIVar3 = *ppIVar6;
  if (pIVar3 == (Io_BlifObj_t *)0x0) {
    uVar16 = (ulong)p->vLines->nSize;
    uVar13 = 0xffffffff;
    if (0 < (long)uVar16) {
      uVar14 = 0;
      do {
        if (pName < p->vLines->pArray[uVar14]) {
          uVar13 = uVar14 & 0xffffffff;
          break;
        }
        uVar14 = uVar14 + 1;
      } while (uVar16 != uVar14);
    }
    pcVar15 = "Line %d: Signal (%s) is not defined as a table.";
LAB_002cd831:
    sprintf(p->sError,pcVar15,uVar13,pName);
    return (Abc_Obj_t *)0x0;
  }
  uVar5 = *(uint *)pIVar3;
  if ((uVar5 & 0x20) != 0) {
    uVar16 = (ulong)p->vLines->nSize;
    uVar13 = 0xffffffff;
    if (0 < (long)uVar16) {
      uVar14 = 0;
      do {
        if (pName < p->vLines->pArray[uVar14]) {
          uVar13 = uVar14 & 0xffffffff;
          break;
        }
        uVar14 = uVar14 + 1;
      } while (uVar16 != uVar14);
    }
    pcVar15 = "Line %d: Signal (%s) appears twice on a combinational path.";
    goto LAB_002cd831;
  }
  if ((Abc_Obj_t *)pIVar3->pEquiv != (Abc_Obj_t *)0x0) {
    return (Abc_Obj_t *)pIVar3->pEquiv;
  }
  *(uint *)pIVar3 = uVar5 | 0x20;
  vTokens = (Vec_Ptr_t *)malloc(0x10);
  vTokens->nCap = 8;
  vTokens->nSize = 0;
  ppvVar7 = (void **)malloc(0x40);
  vTokens->pArray = ppvVar7;
  Io_BlifCollectTokens(vTokens,pIVar3->pName + -(ulong)(uVar5 >> 8),pIVar3->pName);
  iVar2 = vTokens->nSize;
  if (0 < (long)iVar2) {
    ppvVar7 = vTokens->pArray;
    lVar18 = 0;
    do {
      pAVar8 = Io_BlifParseConstruct_rec(p,(char *)ppvVar7[lVar18]);
      if (pAVar8 == (Abc_Obj_t *)0x0) {
        free(ppvVar7);
        free(vTokens);
        return (Abc_Obj_t *)0x0;
      }
      ppvVar7[lVar18] = pAVar8;
      lVar18 = lVar18 + 1;
    } while (iVar2 != lVar18);
  }
  pcVar15 = pIVar3->pName;
  sVar9 = strlen(pcVar15);
  p->nTablesRead = p->nTablesRead + 1;
  Io_BlifSplitIntoTokens(p->vTokens,pcVar15 + sVar9,'.');
  pVVar10 = p->vTokens;
  uVar5 = pVVar10->nSize;
  if (uVar5 == 1) {
    pcVar15 = (char *)*pVVar10->pArray;
    if (((*pcVar15 - 0x30U & 0x8e) != 0) || (pcVar15[1] != '\0')) {
      uVar16 = (ulong)p->vLines->nSize;
      uVar13 = 0xffffffff;
      if (0 < (long)uVar16) {
        uVar14 = 0;
        do {
          if (pcVar15 < p->vLines->pArray[uVar14]) {
            uVar13 = uVar14 & 0xffffffff;
            break;
          }
          uVar14 = uVar14 + 1;
        } while (uVar16 != uVar14);
      }
      pcVar17 = "Line %d: Constant table has wrong output value (%s).";
      goto LAB_002cdaa0;
    }
    pAVar11 = Abc_AigConst1(p->pAig);
    pAVar8 = (Abc_Obj_t *)(ulong)(*pcVar15 == '0');
  }
  else {
    if (uVar5 == 0) {
      pAVar8 = Abc_AigConst1(p->pAig);
      pAVar8 = (Abc_Obj_t *)((ulong)pAVar8 ^ 1);
      goto LAB_002cdb31;
    }
    if ((int)uVar5 < 1) {
LAB_002cdc2f:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    if ((uVar5 & 1) != 0) {
      uVar13 = (ulong)p->vLines->nSize;
      uVar16 = 0xffffffff;
      if (0 < (long)uVar13) {
        uVar14 = 0;
        do {
          if (*pVVar10->pArray < p->vLines->pArray[uVar14]) {
            uVar16 = uVar14 & 0xffffffff;
            break;
          }
          uVar14 = uVar14 + 1;
        } while (uVar13 != uVar14);
      }
      pAVar8 = (Abc_Obj_t *)0x0;
      sprintf(p->sError,"Line %d: Table has odd number of tokens (%d).",uVar16);
      goto LAB_002cdb31;
    }
    pAVar8 = Abc_AigConst1(p->pAig);
    pAVar8 = (Abc_Obj_t *)((ulong)pAVar8 ^ 1);
    pVVar10 = p->vTokens;
    uVar5 = pVVar10->nSize;
    if (1 < (int)uVar5) {
      local_3c = 0xffffffff;
      lVar18 = 0;
LAB_002cd8fe:
      if (((long)(int)uVar5 <= lVar18 * 2) || (uVar16 = lVar18 * 2 | 1, uVar5 <= uVar16))
      goto LAB_002cdc2f;
      pcVar17 = (char *)pVVar10->pArray[lVar18 * 2];
      pcVar15 = (char *)pVVar10->pArray[uVar16];
      sVar9 = strlen(pcVar17);
      uVar16 = (ulong)(uint)vTokens->nSize;
      if (sVar9 == uVar16) {
        uVar5 = (int)*pcVar15 - 0x30;
        if (((uVar5 & 0x8e) == 0) && (pcVar15[1] == '\0')) {
          uVar4 = uVar5;
          if ((local_3c == 0xffffffff) || (uVar4 = local_3c, local_3c == uVar5)) {
            local_3c = uVar4;
            pAVar11 = Abc_AigConst1(p->pAig);
            lVar19 = 0;
            do {
              bVar1 = pcVar17[lVar19];
              if (bVar1 < 0x30) {
                if (bVar1 != 0x2d) goto LAB_002cd9fe;
              }
              else {
                if (bVar1 == 0x31) {
                  if (vTokens->nSize <= lVar19) goto LAB_002cdc2f;
                  pMan = (Abc_Aig_t *)p->pAig->pManFunc;
                  p1 = (Abc_Obj_t *)vTokens->pArray[lVar19];
                }
                else {
                  if (bVar1 != 0x30) goto LAB_002cdab0;
                  if (vTokens->nSize <= lVar19) goto LAB_002cdc2f;
                  pMan = (Abc_Aig_t *)p->pAig->pManFunc;
                  p1 = (Abc_Obj_t *)((ulong)vTokens->pArray[lVar19] ^ 1);
                }
                pAVar11 = Abc_AigAnd(pMan,pAVar11,p1);
              }
              lVar19 = lVar19 + 1;
            } while( true );
          }
          uVar16 = (ulong)p->vLines->nSize;
          uVar14 = 0xffffffff;
          if ((long)uVar16 < 1) goto LAB_002cdc15;
          uVar13 = 0;
          goto LAB_002cdbec;
        }
        uVar16 = (ulong)p->vLines->nSize;
        uVar13 = 0xffffffff;
        if ((long)uVar16 < 1) goto LAB_002cdbb8;
        uVar14 = 0;
        goto LAB_002cdb77;
      }
      uVar13 = (ulong)p->vLines->nSize;
      uVar14 = 0xffffffff;
      if ((long)uVar13 < 1) goto LAB_002cdbfe;
      uVar12 = 0;
      goto LAB_002cdba6;
    }
    pAVar11 = (Abc_Obj_t *)0x0;
  }
  goto LAB_002cdb13;
LAB_002cd9fe:
  if (bVar1 != 0) {
LAB_002cdab0:
    uVar16 = (ulong)(uint)(int)(char)bVar1;
    uVar13 = (ulong)p->vLines->nSize;
    uVar14 = 0xffffffff;
    if ((long)uVar13 < 1) goto LAB_002cdb1a;
    uVar12 = 0;
    goto LAB_002cdad3;
  }
  pAVar8 = Abc_AigOr((Abc_Aig_t *)p->pAig->pManFunc,pAVar8,pAVar11);
  lVar18 = lVar18 + 1;
  pVVar10 = p->vTokens;
  uVar5 = pVVar10->nSize;
  if ((int)uVar5 / 2 <= lVar18) goto code_r0x002cda49;
  goto LAB_002cd8fe;
code_r0x002cda49:
  pAVar11 = (Abc_Obj_t *)(ulong)(local_3c == 0);
LAB_002cdb13:
  pAVar8 = (Abc_Obj_t *)((ulong)pAVar8 ^ (ulong)pAVar11);
  goto LAB_002cdb31;
  while (uVar12 = uVar12 + 1, uVar13 != uVar12) {
LAB_002cdad3:
    if (pcVar17 < p->vLines->pArray[uVar12]) {
      uVar14 = uVar12 & 0xffffffff;
      break;
    }
  }
LAB_002cdb1a:
  __format = "Line %d: Product term (%s) contains character (%c).";
  goto LAB_002cdb2a;
  while (uVar13 = uVar13 + 1, uVar16 != uVar13) {
LAB_002cdbec:
    if (pcVar17 < p->vLines->pArray[uVar13]) {
      uVar14 = uVar13 & 0xffffffff;
      break;
    }
  }
LAB_002cdc15:
  __format = 
  "Line %d: Output value (%s) differs from the value in the first line of the table (%d).";
  uVar16 = (ulong)local_3c;
  pcVar17 = pcVar15;
  goto LAB_002cdb2a;
  while (uVar14 = uVar14 + 1, uVar16 != uVar14) {
LAB_002cdb77:
    if (pcVar17 < p->vLines->pArray[uVar14]) {
      uVar13 = uVar14 & 0xffffffff;
      break;
    }
  }
LAB_002cdbb8:
  pcVar17 = "Line %d: Output value (%s) is incorrect.";
LAB_002cdaa0:
  pAVar8 = (Abc_Obj_t *)0x0;
  sprintf(p->sError,pcVar17,uVar13,pcVar15);
  goto LAB_002cdb31;
  while (uVar12 = uVar12 + 1, uVar13 != uVar12) {
LAB_002cdba6:
    if (pcVar17 < p->vLines->pArray[uVar12]) {
      uVar14 = uVar12 & 0xffffffff;
      break;
    }
  }
LAB_002cdbfe:
  __format = "Line %d: Cube (%s) has size different from the fanin count (%d).";
LAB_002cdb2a:
  pAVar8 = (Abc_Obj_t *)0x0;
  sprintf(p->sError,__format,uVar14,pcVar17,uVar16);
LAB_002cdb31:
  pIVar3->pEquiv = pAVar8;
  if (vTokens->pArray != (void **)0x0) {
    free(vTokens->pArray);
    pAVar8 = (Abc_Obj_t *)pIVar3->pEquiv;
  }
  free(vTokens);
  *(byte *)pIVar3 = *(byte *)pIVar3 & 0xdf;
  return pAVar8;
}

Assistant:

static Abc_Obj_t * Io_BlifParseConstruct_rec( Io_BlifMan_t * p, char * pName )
{
    Vec_Ptr_t * vFanins;
    Abc_Obj_t * pFaninAbc;
    Io_BlifObj_t * pObjIo;
    char * pNameFanin;
    int i;
    // get the IO object with this name
    pObjIo = *Io_BlifHashLookup( p, pName );
    if ( pObjIo == NULL )
    {
        sprintf( p->sError, "Line %d: Signal (%s) is not defined as a table.", Io_BlifGetLine(p, pName), pName );
        return NULL;
    }
    // loop detection
    if ( pObjIo->fLoop )
    {
        sprintf( p->sError, "Line %d: Signal (%s) appears twice on a combinational path.", Io_BlifGetLine(p, pName), pName );
        return NULL;
    }
    // check if the AIG is already constructed
    if ( pObjIo->pEquiv )
        return (Abc_Obj_t *)pObjIo->pEquiv;
    // mark this node on the path
    pObjIo->fLoop = 1;
    // construct the AIGs for the fanins
    vFanins = Vec_PtrAlloc( 8 );
    Io_BlifCollectTokens( vFanins, pObjIo->pName - pObjIo->Offset, pObjIo->pName );
    Vec_PtrForEachEntry( char *, vFanins, pNameFanin, i )
    {
        pFaninAbc = Io_BlifParseConstruct_rec( p, pNameFanin );
        if ( pFaninAbc == NULL )
        {
            Vec_PtrFree( vFanins );
            return NULL;
        }
        Vec_PtrWriteEntry( vFanins, i, pFaninAbc );
    }
    // construct the node
    pObjIo->pEquiv = Io_BlifParseTable( p, pObjIo->pName + strlen(pObjIo->pName), vFanins );
    Vec_PtrFree( vFanins );
    // unmark this node on the path
    pObjIo->fLoop = 0;
    // remember the new node
    return (Abc_Obj_t *)pObjIo->pEquiv;
}